

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_selist.c
# Opt level: O1

void test_push_doesnt_invalidate_iterator(CuTest *tc)

{
  void *actual;
  char *data;
  char *expected;
  long lVar1;
  int qi;
  selist *ql;
  selist *list;
  int local_44;
  selist *local_40;
  selist *local_38;
  
  local_38 = (selist *)0x0;
  local_40 = (selist *)0x0;
  local_44 = 0;
  expected = 
  "Lorem ipsum dolor sit amet, consectetur adipisicing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
  ;
  selist_push(&local_38,
              "Lorem ipsum dolor sit amet, consectetur adipisicing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
             );
  local_40 = local_38;
  data = 
  "Lorem ipsum dolor sit amet, consectetur adipisicing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
  ;
  lVar1 = 0x2a;
  do {
    data = data + 2;
    actual = selist_get(local_40,local_44);
    CuAssertPtrEquals_LineMsg
              (tc,
               "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c"
               ,0xca,(char *)0x0,expected,actual);
    selist_push(&local_38,data + -1);
    selist_advance(&local_40,&local_44,1);
    selist_push(&local_38,data);
    expected = expected + 1;
    lVar1 = lVar1 + -1;
  } while (lVar1 != 0);
  selist_free(local_40);
  return;
}

Assistant:

static void test_push_doesnt_invalidate_iterator(CuTest * tc)
{
    struct selist *list = NULL, *ql = NULL;
    int i, qi = 0;
    selist_push(&list, (void*)lipsum);
    ql = list;
    for (i = 0; i != 42; ++i) {
        void * n;
        n = selist_get(ql, qi);
        CuAssertPtrEquals(tc, (void *)(lipsum + i), n);
        selist_push(&list, (void *)(lipsum + (i * 2 + 1)));
        selist_advance(&ql, &qi, 1);
        selist_push(&list, (void *)(lipsum + (i * 2 + 2)));
    }
    selist_free(ql);
}